

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

knot_style ON_KnotVectorStyle(int order,int cv_count,double *knot)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  knot_style kVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  
  kVar4 = unknown_knot_style;
  if ((1 < order) && (knot != (double *)0x0 && order <= cv_count)) {
    dVar2 = knot[(ulong)(uint)order - 2];
    if (dVar2 < knot[cv_count - 1U]) {
      lVar10 = (long)cv_count;
      dVar13 = ((knot[cv_count - 1U] - knot[lVar10 + -2]) + (knot[order - 1U] - dVar2)) * 0.5;
      dVar14 = dVar13 * 1e-06;
      if ((((cv_count < order) || (knot[lVar10 + -1] != knot[(long)(cv_count + order) + -3])) ||
          (NAN(knot[lVar10 + -1]) || NAN(knot[(long)(cv_count + order) + -3]))) ||
         ((*knot != dVar2 || (NAN(*knot) || NAN(dVar2))))) {
        kVar4 = uniform_knots;
        if (3 < cv_count + order) {
          uVar6 = (cv_count + order) - 2;
          uVar5 = 2;
          if (2 < (int)uVar6) {
            uVar5 = (ulong)uVar6;
          }
          uVar8 = 1;
          do {
            if (dVar14 < ABS((knot[uVar8] - knot[uVar8 - 1]) - dVar13)) {
              return non_uniform_knots;
            }
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
      }
      else {
        iVar7 = cv_count - order;
        if (iVar7 == 0) {
          return piecewise_bezier_knots;
        }
        bVar12 = order <= cv_count;
        kVar4 = quasi_uniform_knots;
        if (order <= cv_count) {
          lVar9 = (long)(int)(order - 1U);
          lVar11 = lVar9;
          if (ABS((knot[lVar9] - knot[lVar9 + -1]) - dVar13) <= dVar14) {
            do {
              bVar12 = iVar7 == 0;
              iVar7 = iVar7 + -1;
              if (bVar12) {
                return quasi_uniform_knots;
              }
              lVar3 = lVar11 + 1;
              pdVar1 = knot + lVar11;
              lVar11 = lVar11 + 1;
            } while (ABS((knot[lVar3] - *pdVar1) - dVar13) <= dVar14);
            bVar12 = lVar11 < lVar10;
          }
          if (bVar12) {
            kVar4 = clamped_end_knots;
            lVar10 = 0;
            do {
              if ((long)(int)(cv_count - 1U) <= lVar10 + lVar9) {
                return piecewise_bezier_knots;
              }
              lVar11 = lVar9 + lVar10;
              lVar3 = lVar10 + -1;
            } while ((knot[lVar11] == knot[lVar9 * 2 + lVar3]) &&
                    (lVar10 = lVar10 + lVar9, !NAN(knot[lVar11]) && !NAN(knot[lVar9 * 2 + lVar3])));
          }
        }
      }
    }
  }
  return kVar4;
}

Assistant:

ON::knot_style ON_KnotVectorStyle( 
       int order,
       int cv_count,
       const double* knot
       )
{
  ON::knot_style s = ON::unknown_knot_style;
  if ( order >= 2 && cv_count >= order && knot && knot[order-2] < knot[cv_count-1] ) {
    const int knot_count = order+cv_count-2;
    const double delta = 0.5*((knot[order-1] - knot[order-2]) + (knot[cv_count-1] - knot[cv_count-2]));
    const double ktol = delta*1.0e-6;
    int i;
    if ( ON_IsKnotVectorClamped( order, cv_count, knot ) ) {
      if ( order == cv_count ) {
        s = ON::piecewise_bezier_knots;
      }
      else {
        s = ON::clamped_end_knots;
        for ( i = order-1; i <= cv_count-1; i++ ) {
          if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
            break;
          }
        }
        if ( i >= cv_count ) {
          s = ON::quasi_uniform_knots;
        }
        else {
          const int degree = order-1;
          for ( i = order-1; i < cv_count-1; i += degree ) {
            if ( knot[i] != knot[i+degree-1] )
              break; 
          }
          if ( i >= cv_count-1 )
            s = ON::piecewise_bezier_knots;
        }
      }
    }
    else {
      // check for uniform knots
      s = ON::non_uniform_knots;
      for ( i = 1; i < knot_count; i++ ) {
        if ( fabs(knot[i] - knot[i-1] - delta) > ktol ) {
          break;
        }
      }
      if ( i >= knot_count )
        s = ON::uniform_knots; 
    }
  }
  return s;
}